

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

int Kit_GraphLevelNum_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode)

{
  Kit_Node_t *pKVar1;
  int iVar2;
  int iVar3;
  
  pKVar1 = pGraph->pNodes;
  iVar3 = 0;
  if (pGraph->nLeaves <= (int)((ulong)((long)pNode - (long)pKVar1) >> 3) * -0x55555555) {
    iVar2 = Kit_GraphLevelNum_rec(pGraph,pKVar1 + ((uint)pNode->eEdge0 >> 1 & 0x3fffffff));
    iVar3 = Kit_GraphLevelNum_rec(pGraph,pKVar1 + ((uint)pNode->eEdge1 >> 1 & 0x3fffffff));
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int Kit_GraphLevelNum_rec( Kit_Graph_t * pGraph, Kit_Node_t * pNode )
{
    int Depth0, Depth1;
    if ( Kit_GraphNodeIsVar(pGraph, pNode) )
        return 0;
    Depth0 = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeFanin0(pGraph, pNode) );
    Depth1 = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeFanin1(pGraph, pNode) );
    return 1 + KIT_MAX( Depth0, Depth1 );
}